

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::DragBehaviorT<float,float,float>
               (ImGuiDataType data_type,float *v,float v_speed,float v_min,float v_max,char *format,
               ImGuiSliderFlags flags)

{
  ImGuiInputSource IVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  int iVar4;
  float *pfVar5;
  uint uVar6;
  ulong idx;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_84;
  float local_7c;
  ImVec2 local_38;
  
  pIVar2 = GImGui;
  if ((((v_speed == 0.0) && (!NAN(v_speed))) && (v_min < v_max)) && (v_max - v_min < 3.4028235e+38))
  {
    v_speed = (v_max - v_min) * GImGui->DragSpeedDefaultRatio;
  }
  uVar6 = data_type & 0xfffffffe;
  IVar1 = GImGui->ActiveIdSource;
  idx = (ulong)((flags & 0x100000U) >> 0x14);
  if (IVar1 == ImGuiInputSource_Mouse) {
    bVar3 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar3) ||
       (bVar3 = IsMouseDragPastThreshold(0,(pIVar2->IO).MouseDragThreshold * 0.5), !bVar3)) {
      IVar1 = pIVar2->ActiveIdSource;
      goto LAB_00174a87;
    }
    pfVar5 = ImVec2::operator[](&(pIVar2->IO).MouseDelta,idx);
    fVar9 = *pfVar5;
    if ((pIVar2->IO).KeyAlt != false) {
      fVar9 = fVar9 * 0.01;
    }
    if ((pIVar2->IO).KeyShift == true) {
      fVar9 = fVar9 * 10.0;
    }
  }
  else {
LAB_00174a87:
    fVar9 = 0.0;
    if (IVar1 == ImGuiInputSource_Nav) {
      iVar4 = 0;
      if (uVar6 == 8) {
        iVar4 = ImParseFormatPrecision(format,3);
      }
      local_38 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      pfVar5 = ImVec2::operator[](&local_38,idx);
      fVar9 = *pfVar5;
      fVar7 = GetMinimumStepAtDecimalPrecision(iVar4);
      v_speed = (float)((uint)v_speed & -(uint)(fVar7 <= v_speed) |
                       ~-(uint)(fVar7 <= v_speed) & (uint)fVar7);
    }
  }
  fVar9 = fVar9 * v_speed;
  if ((flags & 0x100000U) != 0) {
    fVar9 = -fVar9;
  }
  if ((((flags & 0x20U) != 0) && (fVar7 = v_max - v_min, fVar7 < 3.4028235e+38)) && (1e-06 < fVar7))
  {
    fVar9 = fVar9 / fVar7;
  }
  if (v_min < v_max) {
    if ((v_max <= *v) && (0.0 < fVar9)) goto LAB_00174bc2;
    bVar3 = *v <= v_min && fVar9 < 0.0;
  }
  else {
    bVar3 = false;
  }
  if ((pIVar2->ActiveIdIsJustActivated == false) && (!bVar3)) {
    if ((fVar9 != 0.0) || (NAN(fVar9))) {
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum + fVar9;
      pIVar2->DragCurrentAccumDirty = true;
    }
    else if ((pIVar2->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    fVar7 = *v;
    if ((flags & 0x20U) == 0) {
      fVar7 = fVar7 + pIVar2->DragCurrentAccum;
      local_7c = 0.0;
      local_84 = 0.0;
    }
    else {
      if (uVar6 == 8) {
        iVar4 = ImParseFormatPrecision(format,3);
        fVar8 = (float)iVar4;
      }
      else {
        fVar8 = 1.0;
      }
      local_84 = powf(0.1,fVar8);
      local_7c = ScaleRatioFromValueT<float,float,float>
                           (data_type,fVar7,v_min,v_max,true,local_84,0.0);
      fVar7 = ScaleValueFromRatioT<float,float,float>
                        (data_type,local_7c + pIVar2->DragCurrentAccum,v_min,v_max,true,local_84,0.0
                        );
    }
    if ((flags & 0x40U) == 0) {
      fVar7 = RoundScalarWithFormatT<float,float>(format,data_type,fVar7);
    }
    pIVar2->DragCurrentAccumDirty = false;
    if ((flags & 0x20U) == 0) {
      fVar8 = fVar7 - *v;
    }
    else {
      fVar8 = ScaleRatioFromValueT<float,float,float>(data_type,fVar7,v_min,v_max,true,local_84,0.0)
      ;
      fVar8 = fVar8 - local_7c;
    }
    pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - fVar8;
    fVar7 = (float)(~-(uint)(fVar7 == 0.0) & (uint)fVar7);
    fVar8 = *v;
    if (v_min < v_max) {
      if ((fVar8 != fVar7) || (NAN(fVar8) || NAN(fVar7))) {
        if ((fVar7 < v_min) || (((uVar6 != 8 && (fVar8 < fVar7)) && (fVar9 < 0.0)))) {
          fVar7 = v_min;
        }
        if ((v_max < fVar7) || (((uVar6 != 8 && (fVar7 < fVar8)) && (0.0 < fVar9)))) {
          fVar7 = v_max;
        }
      }
    }
    if ((fVar8 == fVar7) && (!NAN(fVar8) && !NAN(fVar7))) {
      return false;
    }
    *v = fVar7;
    return true;
  }
LAB_00174bc2:
  pIVar2->DragCurrentAccum = 0.0;
  pIVar2->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}